

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O0

void Abc_TtMask(word *pTruth,int nWords,int nBits)

{
  word wVar1;
  int local_1c;
  int w;
  int nBits_local;
  int nWords_local;
  word *pTruth_local;
  
  if ((-1 < nBits) && (nBits <= nWords * 0x40)) {
    for (local_1c = 0; local_1c < nWords; local_1c = local_1c + 1) {
      if (nBits < (local_1c + 1) * 0x40) {
        if (local_1c * 0x40 < nBits) {
          wVar1 = Abc_Tt6Mask(nBits + local_1c * -0x40);
          pTruth[local_1c] = wVar1;
        }
        else {
          pTruth[local_1c] = 0;
        }
      }
      else {
        pTruth[local_1c] = 0xffffffffffffffff;
      }
    }
    return;
  }
  __assert_fail("nBits >= 0 && nBits <= nWords * 64",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                ,0xc6,"void Abc_TtMask(word *, int, int)");
}

Assistant:

static inline void Abc_TtMask( word * pTruth, int nWords, int nBits )
{ 
    int w;
    assert( nBits >= 0 && nBits <= nWords * 64 );
    for ( w = 0; w < nWords; w++ )
        if ( nBits >= (w + 1) * 64 )
            pTruth[w] = ~(word)0;
        else if ( nBits > w * 64 )
            pTruth[w] = Abc_Tt6Mask( nBits - w * 64 );
        else
            pTruth[w] = 0;
}